

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void save_oct_float(char *filename,float *input,int in_len,float *output,int out_len)

{
  FILE *__stream;
  int local_3c;
  int k;
  FILE *file;
  int out_len_local;
  float *output_local;
  int in_len_local;
  float *input_local;
  char *filename_local;
  
  printf("Dumping input and output data to file : %s.\n\n",filename);
  __stream = fopen(filename,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"# Not created by Octave\n");
    fprintf(__stream,"# name: input\n");
    fprintf(__stream,"# type: matrix\n");
    fprintf(__stream,"# rows: %d\n",(ulong)(uint)in_len);
    fprintf(__stream,"# columns: 1\n");
    for (local_3c = 0; local_3c < in_len; local_3c = local_3c + 1) {
      fprintf(__stream,"% g\n",(double)input[local_3c]);
    }
    fprintf(__stream,"# name: output\n");
    fprintf(__stream,"# type: matrix\n");
    fprintf(__stream,"# rows: %d\n",(ulong)(uint)out_len);
    fprintf(__stream,"# columns: 1\n");
    for (local_3c = 0; local_3c < out_len; local_3c = local_3c + 1) {
      fprintf(__stream,"% g\n",(double)output[local_3c]);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void
save_oct_float (char *filename, float *input, int in_len, float *output, int out_len)
{	FILE 	*file ;
	int		k ;

	printf ("Dumping input and output data to file : %s.\n\n", filename) ;

	if (! (file = fopen (filename, "w")))
		return ;

	fprintf (file, "# Not created by Octave\n") ;

	fprintf (file, "# name: input\n") ;
	fprintf (file, "# type: matrix\n") ;
	fprintf (file, "# rows: %d\n", in_len) ;
	fprintf (file, "# columns: 1\n") ;

	for (k = 0 ; k < in_len ; k++)
		fprintf (file, "% g\n", input [k]) ;

	fprintf (file, "# name: output\n") ;
	fprintf (file, "# type: matrix\n") ;
	fprintf (file, "# rows: %d\n", out_len) ;
	fprintf (file, "# columns: 1\n") ;

	for (k = 0 ; k < out_len ; k++)
		fprintf (file, "% g\n", output [k]) ;

	fclose (file) ;
	return ;
}